

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O3

Index * getIndex(string *threadId)

{
  pointer pEVar1;
  __normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
  _Var2;
  Index newIndex;
  string *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  code *local_198;
  undefined1 local_190 [72];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  Index local_128;
  pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_> local_c0;
  
  local_1a8 = 0;
  local_198 = std::
              _Function_handler<bool_(const_Index_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/StdBot.cpp:22:37)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<bool_(const_Index_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/StdBot.cpp:22:37)>
              ::_M_manager;
  local_1b0 = threadId;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Cache<Index>::Entry*,std::vector<Cache<Index>::Entry,std::allocator<Cache<Index>::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Cache<Index>::find(std::function<bool(Index_const&)>)::_lambda(Cache<Index>::Entry_const&)_1_>>
                    (threadCache.entries.
                     super__Vector_base<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     threadCache.entries.
                     super__Vector_base<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  pEVar1 = threadCache.entries.
           super__Vector_base<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_1a0 != (code *)0x0) {
    (*local_1a0)(&local_1b0,&local_1b0,3);
  }
  if ((_Var2._M_current == (Entry *)0x0) || (_Var2._M_current == pEVar1)) {
    Reddit::requestThread(&local_c0,reddit,threadId);
    Index::Index(&local_128,&local_c0.first,&local_c0.second);
    std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
    _Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
              *)local_190,
             (_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
              *)&local_128);
    std::vector<LinkedToken,_std::allocator<LinkedToken>_>::vector
              ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)(local_190 + 0x30),
               &local_128.links);
    local_148._M_p = (pointer)&local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_128.threadId._M_dataplus._M_p,
               local_128.threadId._M_dataplus._M_p + local_128.threadId._M_string_length);
    _Var2._M_current = (Entry *)Cache<Index>::add(&threadCache,(Index *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != &local_138) {
      operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
    }
    std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector
              ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)(local_190 + 0x30));
    std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
    ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
               *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.threadId._M_dataplus._M_p != &local_128.threadId.field_2) {
      operator_delete(local_128.threadId._M_dataplus._M_p,
                      local_128.threadId.field_2._M_allocated_capacity + 1);
    }
    std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector(&local_128.links);
    std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
    ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
               *)&local_128);
    std::vector<Comment,_std::allocator<Comment>_>::~vector(&local_c0.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first.link._M_dataplus._M_p != &local_c0.first.link.field_2) {
      operator_delete(local_c0.first.link._M_dataplus._M_p,
                      local_c0.first.link.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first.title._M_dataplus._M_p != &local_c0.first.title.field_2) {
      operator_delete(local_c0.first.title._M_dataplus._M_p,
                      local_c0.first.title.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first.selftext._M_dataplus._M_p != &local_c0.first.selftext.field_2) {
      operator_delete(local_c0.first.selftext._M_dataplus._M_p,
                      local_c0.first.selftext.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first.id._M_dataplus._M_p != &local_c0.first.id.field_2) {
      operator_delete(local_c0.first.id._M_dataplus._M_p,
                      local_c0.first.id.field_2._M_allocated_capacity + 1);
    }
  }
  return &(_Var2._M_current)->data;
}

Assistant:

Index* getIndex(const std::string& threadId) {
    Index* index = threadCache.find([&](const Index& i) {
        return i.getThreadId() == threadId;
    });

    if (index == nullptr) {
        const auto& [thread, commentList] = reddit->requestThread(threadId);
        Index newIndex(thread, commentList);
        index = threadCache.add(newIndex);
    }

    return index;
}